

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O3

void __thiscall ASTree::toDot(ASTree *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_b8;
  string local_98;
  Graph local_78;
  
  paVar1 = &local_78.rankdir.field_2;
  local_78.rankdir._M_string_length = 0;
  local_78.rankdir.field_2._8_8_ = 0;
  local_78.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.rankdir.field_2._M_allocated_capacity = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78.rankdir._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"TB","");
  Graph::setRankdir(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  expandDot(this,&local_78);
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + filename->_M_string_length);
  Graph::build_file(&local_78,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.rankdir._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.rankdir._M_dataplus._M_p,
                    local_78.rankdir.field_2._M_allocated_capacity + 1);
  }
  std::vector<Connection,_std::allocator<Connection>_>::~vector(&local_78.connections);
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_78.nodes);
  return;
}

Assistant:

void ASTree::toDot(std::string filename) {
    Graph graph = Graph();
    graph.setRankdir("TB");
    expandDot(graph);
    graph.build_file(filename);
}